

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evmap.c
# Opt level: O1

int evmap_io_del_(event_base *base,int fd,event *ev)

{
  ushort uVar1;
  ushort uVar2;
  void *pvVar3;
  event *peVar4;
  short sVar5;
  short sVar6;
  int iVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  bool bVar12;
  
  if (fd < 0) {
    return 0;
  }
  if (ev->ev_fd == fd) {
    if ((base->io).nentries <= fd) {
      return -1;
    }
    pvVar3 = (base->io).entries[(uint)fd];
    uVar1 = *(ushort *)((long)pvVar3 + 8);
    uVar11 = (uint)uVar1;
    bVar12 = uVar1 != 0;
    sVar5 = bVar12 + 4 + (ushort)bVar12;
    if (*(ushort *)((long)pvVar3 + 10) == 0) {
      sVar5 = (ushort)bVar12 * 2;
    }
    sVar6 = sVar5 + 0x80;
    if (*(ushort *)((long)pvVar3 + 0xc) == 0) {
      sVar6 = sVar5;
    }
    uVar2 = ev->ev_events;
    uVar8 = 0;
    if ((uVar2 & 2) != 0) {
      uVar11 = uVar1 - 1;
      if (uVar1 == 0) goto LAB_001f1810;
      uVar8 = (ushort)(uVar11 == 0) * 2;
    }
    uVar10 = (uint)*(ushort *)((long)pvVar3 + 10);
    if ((uVar2 & 4) != 0) {
      if (uVar10 - 1 == 0) {
        uVar8 = uVar8 + 4;
      }
      bVar12 = uVar10 == 0;
      uVar10 = uVar10 - 1;
      if (bVar12) goto LAB_001f1815;
    }
    uVar9 = (uint)*(ushort *)((long)pvVar3 + 0xc);
    if ((char)uVar2 < '\0') {
      if (uVar9 - 1 == 0) {
        uVar8 = uVar8 + 0x80;
      }
      bVar12 = uVar9 == 0;
      uVar9 = uVar9 - 1;
      if (bVar12) goto LAB_001f181a;
    }
    if (uVar8 == 0) {
      iVar7 = 0;
    }
    else {
      iVar7 = (*base->evsel->del)(base,ev->ev_fd,sVar6,uVar8 | uVar2 & 0x20,
                                  (void *)((long)pvVar3 + 0x10));
      iVar7 = (uint)(iVar7 != -1) * 2 + -1;
    }
    *(short *)((long)pvVar3 + 8) = (short)uVar11;
    *(short *)((long)pvVar3 + 10) = (short)uVar10;
    *(short *)((long)pvVar3 + 0xc) = (short)uVar9;
    peVar4 = (ev->ev_).ev_io.ev_io_next.le_next;
    if (peVar4 != (event *)0x0) {
      (peVar4->ev_).ev_io.ev_io_next.le_prev = (ev->ev_).ev_io.ev_io_next.le_prev;
    }
    *(ev->ev_).ev_io.ev_io_next.le_prev = (ev->ev_).ev_io.ev_io_next.le_next;
    return iVar7;
  }
  evmap_io_del__cold_1();
LAB_001f1810:
  evmap_io_del__cold_2();
LAB_001f1815:
  evmap_io_del__cold_3();
LAB_001f181a:
  evmap_io_del__cold_4();
}

Assistant:

int
evmap_io_del_(struct event_base *base, evutil_socket_t fd, struct event *ev)
{
	const struct eventop *evsel = base->evsel;
	struct event_io_map *io = &base->io;
	struct evmap_io *ctx;
	int nread, nwrite, nclose, retval = 0;
	short res = 0, old = 0;

	if (fd < 0)
		return 0;

	EVUTIL_ASSERT(fd == ev->ev_fd);

#ifndef EVMAP_USE_HT
	if (fd >= io->nentries)
		return (-1);
#endif

	GET_IO_SLOT(ctx, io, fd, evmap_io);

	nread = ctx->nread;
	nwrite = ctx->nwrite;
	nclose = ctx->nclose;

	if (nread)
		old |= EV_READ;
	if (nwrite)
		old |= EV_WRITE;
	if (nclose)
		old |= EV_CLOSED;

	if (ev->ev_events & EV_READ) {
		if (--nread == 0)
			res |= EV_READ;
		EVUTIL_ASSERT(nread >= 0);
	}
	if (ev->ev_events & EV_WRITE) {
		if (--nwrite == 0)
			res |= EV_WRITE;
		EVUTIL_ASSERT(nwrite >= 0);
	}
	if (ev->ev_events & EV_CLOSED) {
		if (--nclose == 0)
			res |= EV_CLOSED;
		EVUTIL_ASSERT(nclose >= 0);
	}

	if (res) {
		void *extra = ((char*)ctx) + sizeof(struct evmap_io);
		if (evsel->del(base, ev->ev_fd,
			old, (ev->ev_events & EV_ET) | res, extra) == -1) {
			retval = -1;
		} else {
			retval = 1;
		}
	}

	ctx->nread = nread;
	ctx->nwrite = nwrite;
	ctx->nclose = nclose;
	LIST_REMOVE(ev, ev_io_next);

	return (retval);
}